

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.hpp
# Opt level: O0

void __thiscall
pg::Solvers::_add(Solvers *this,string *id,string *description,bool isParallel,
                 SolverConstructor *constructor)

{
  mapped_type *this_00;
  SolverInfo local_78;
  function<std::unique_ptr<pg::Solver,_std::default_delete<pg::Solver>_>_(pg::Oink_&,_pg::Game_&)>
  *local_30;
  SolverConstructor *constructor_local;
  string *psStack_20;
  bool isParallel_local;
  string *description_local;
  string *id_local;
  Solvers *this_local;
  
  local_30 = constructor;
  constructor_local._7_1_ = isParallel;
  psStack_20 = description;
  description_local = id;
  id_local = (string *)this;
  std::__cxx11::string::string((string *)&local_78,(string *)description);
  local_78.isParallel = (bool)(constructor_local._7_1_ & 1);
  std::
  function<std::unique_ptr<pg::Solver,_std::default_delete<pg::Solver>_>_(pg::Oink_&,_pg::Game_&)>::
  function(&local_78.constructor,local_30);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pg::Solvers::SolverInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pg::Solvers::SolverInfo>_>_>
            ::operator[](&this->solvers,description_local);
  SolverInfo::operator=(this_00,&local_78);
  SolverInfo::~SolverInfo(&local_78);
  return;
}

Assistant:

void _add(const std::string& id, const std::string& description, bool isParallel, const SolverConstructor& constructor)
    {
        solvers[id] = {description, isParallel, constructor};
    }